

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_features_change(lys_module *module,char *name,int op)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char *local_68;
  lys_feature *local_50;
  lys_feature *f;
  int iStack_40;
  uint8_t fsize;
  int failk;
  int failj;
  int faili;
  int progress;
  int k;
  int j;
  int i;
  int all;
  int op_local;
  char *name_local;
  lys_module *module_local;
  
  if (((module == (lys_module *)0x0) || (name == (char *)0x0)) || (sVar2 = strlen(name), sVar2 == 0)
     ) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_features_change");
    module_local._4_4_ = 1;
  }
  else {
    iVar1 = strcmp(name,"*");
    bVar3 = iVar1 == 0;
    f._4_4_ = 1;
    failj = 1;
    while (failj != 0 && f._4_4_ != 0) {
      failj = 0;
      f._4_4_ = 0;
      for (k = -1; k < (int)(uint)module->inc_size; k = k + 1) {
        if (k == -1) {
          f._3_1_ = module->features_size;
          local_50 = module->features;
        }
        else {
          f._3_1_ = (module->inc[k].submodule)->features_size;
          local_50 = (module->inc[k].submodule)->features;
        }
        for (progress = 0; progress < (int)(uint)f._3_1_; progress = progress + 1) {
          if ((bVar3) || (iVar1 = strcmp(local_50[progress].name,name), iVar1 == 0)) {
            if (((op == 0) || ((local_50[progress].flags & 0x100) == 0)) &&
               ((op != 0 || ((local_50[progress].flags & 0x100) != 0)))) {
              if (op == 0) {
                lys_features_disable_recursive(local_50 + progress);
                failj = failj + 1;
              }
              else {
                for (faili = 0; faili < (int)(uint)local_50[progress].iffeature_size;
                    faili = faili + 1) {
                  iVar1 = resolve_iffeature(local_50[progress].iffeature + faili);
                  if (iVar1 == 0) {
                    if (!bVar3) {
                      ly_log(module->ctx,LY_LLERR,LY_EINVAL,
                             "Feature \"%s\" is disabled by its %d. if-feature condition.",
                             local_50[progress].name,(ulong)(faili + 1));
                      return 1;
                    }
                    failk = k;
                    iStack_40 = progress;
                    f._4_4_ = faili + 1;
                    break;
                  }
                }
                if (faili == (uint)local_50[progress].iffeature_size) {
                  local_50[progress].flags = local_50[progress].flags | 0x100;
                  failj = failj + 1;
                }
              }
              if (!bVar3) {
                return 0;
              }
            }
            else if (!bVar3) {
              return 0;
            }
          }
        }
      }
    }
    if (f._4_4_ == 0) {
      if (bVar3) {
        module_local._4_4_ = 0;
      }
      else {
        module_local._4_4_ = 1;
      }
    }
    else {
      if (failk == -1) {
        local_68 = module->features[iStack_40].name;
      }
      else {
        local_68 = (module->inc[failk].submodule)->features[iStack_40].name;
      }
      ly_log(module->ctx,LY_LLERR,LY_EINVAL,
             "Feature \"%s\" is disabled by its %d. if-feature condition.",local_68,(ulong)f._4_4_);
      module_local._4_4_ = 1;
    }
  }
  return module_local._4_4_;
}

Assistant:

static int
lys_features_change(const struct lys_module *module, const char *name, int op)
{
    int all = 0;
    int i, j, k;
    int progress, faili, failj, failk;

    uint8_t fsize;
    struct lys_feature *f;

    if (!module || !name || !strlen(name)) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (!strcmp(name, "*")) {
        /* enable all */
        all = 1;
    }

    progress = failk = 1;
    while (progress && failk) {
        for (i = -1, failk = progress = 0; i < module->inc_size; i++) {
            if (i == -1) {
                fsize = module->features_size;
                f = module->features;
            } else {
                fsize = module->inc[i].submodule->features_size;
                f = module->inc[i].submodule->features;
            }

            for (j = 0; j < fsize; j++) {
                if (all || !strcmp(f[j].name, name)) {
                    if ((op && (f[j].flags & LYS_FENABLED)) || (!op && !(f[j].flags & LYS_FENABLED))) {
                        if (all) {
                            /* skip already set features */
                            continue;
                        } else {
                            /* feature already set correctly */
                            return EXIT_SUCCESS;
                        }
                    }

                    if (op) {
                        /* check referenced features if they are enabled */
                        for (k = 0; k < f[j].iffeature_size; k++) {
                            if (!resolve_iffeature(&f[j].iffeature[k])) {
                                if (all) {
                                    faili = i;
                                    failj = j;
                                    failk = k + 1;
                                    break;
                                } else {
                                    LOGERR(module->ctx, LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
                                           f[j].name, k + 1);
                                    return EXIT_FAILURE;
                                }
                            }
                        }

                        if (k == f[j].iffeature_size) {
                            /* the last check passed, do the change */
                            f[j].flags |= LYS_FENABLED;
                            progress++;
                        }
                    } else {
                        lys_features_disable_recursive(&f[j]);
                        progress++;
                    }
                    if (!all) {
                        /* stop in case changing a single feature */
                        return EXIT_SUCCESS;
                    }
                }
            }
        }
    }
    if (failk) {
        /* print info about the last failing feature */
        LOGERR(module->ctx, LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
               faili == -1 ? module->features[failj].name : module->inc[faili].submodule->features[failj].name, failk);
        return EXIT_FAILURE;
    }

    if (all) {
        return EXIT_SUCCESS;
    } else {
        /* the specified feature not found */
        return EXIT_FAILURE;
    }
}